

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option.hpp
# Opt level: O1

void __thiscall
CLI::OptionBase<CLI::OptionDefaults>::copy_to<CLI::Option>
          (OptionBase<CLI::OptionDefaults> *this,Option *other)

{
  MultiOptionPolicy MVar1;
  MultiOptionPolicy MVar2;
  
  OptionBase<CLI::Option>::group(&other->super_OptionBase<CLI::Option>,&this->group_);
  (other->super_OptionBase<CLI::Option>).required_ = this->required_;
  Option::ignore_case<CLI::App>(other,this->ignore_case_);
  Option::ignore_underscore<CLI::App>(other,this->ignore_underscore_);
  (other->super_OptionBase<CLI::Option>).configurable_ = this->configurable_;
  (other->super_OptionBase<CLI::Option>).disable_flag_override_ = this->disable_flag_override_;
  (other->super_OptionBase<CLI::Option>).delimiter_ = this->delimiter_;
  (other->super_OptionBase<CLI::Option>).always_capture_default_ = this->always_capture_default_;
  MVar1 = this->multi_option_policy_;
  MVar2 = (other->super_OptionBase<CLI::Option>).multi_option_policy_;
  if (MVar2 != MVar1) {
    if (((MVar2 == Throw) && (other->expected_max_ == 0x20000000)) && (1 < other->expected_min_)) {
      other->expected_max_ = other->expected_min_;
    }
    (other->super_OptionBase<CLI::Option>).multi_option_policy_ = MVar1;
    other->current_option_state_ = parsing;
  }
  return;
}

Assistant:

void copy_to(T *other) const {
        other->group(group_);
        other->required(required_);
        other->ignore_case(ignore_case_);
        other->ignore_underscore(ignore_underscore_);
        other->configurable(configurable_);
        other->disable_flag_override(disable_flag_override_);
        other->delimiter(delimiter_);
        other->always_capture_default(always_capture_default_);
        other->multi_option_policy(multi_option_policy_);
    }